

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::LipidTransVisitor::update(LipidTransVisitor *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  AtomType *AT;
  Vector<double,_3U> *in_RDI;
  Vector3d yaxis;
  Vector3d xaxis;
  Vector3d zaxis;
  MultipoleAdapter ma;
  Vector3d v1;
  Vector3d ref;
  Vector<double,_3U> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffe80;
  Vector<double,_3U> *in_stack_fffffffffffffe90;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffe98;
  Vector3<double> *in_stack_fffffffffffffed0;
  Vector3<double> *in_stack_fffffffffffffed8;
  Vector3d *in_stack_fffffffffffffee8;
  Snapshot *in_stack_fffffffffffffef0;
  MultipoleAdapter local_70 [14];
  
  StuntDouble::getPos((StuntDouble *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  StuntDouble::getPos((StuntDouble *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Vector3<double>::operator=((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffe68)
  ;
  OpenMD::operator-((Vector<double,_3U> *)
                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_fffffffffffffe68);
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1].data_[2]);
  SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::wrapVector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  AT = Atom::getAtomType((Atom *)in_RDI[0x43].data_[0]);
  MultipoleAdapter::MultipoleAdapter(local_70,AT);
  Vector3<double>::Vector3((Vector3<double> *)0x34ac3c);
  bVar1 = MultipoleAdapter::isDipole((MultipoleAdapter *)in_stack_fffffffffffffed8);
  if (bVar1) {
    StuntDouble::getDipole
              ((StuntDouble *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    Vector3<double>::operator=
              ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffe68);
  }
  else {
    StuntDouble::getA((StuntDouble *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffffe98);
    OpenMD::operator*(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_RDI);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x34acf1);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x34acfb);
  }
  cross<double>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  cross<double>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  Vector<double,_3U>::normalize(in_RDI);
  Vector<double,_3U>::normalize(in_RDI);
  Vector<double,_3U>::normalize(in_RDI);
  RectMatrix<double,_3U,_3U>::setRow(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_RDI);
  RectMatrix<double,_3U,_3U>::setRow(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_RDI);
  RectMatrix<double,_3U,_3U>::setRow(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_RDI);
  return;
}

Assistant:

void LipidTransVisitor::update() {
    Vector3d ref = refSd_->getPos();
    origin_      = originDatom_->getPos();
    Vector3d v1  = ref - origin_;
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

    MultipoleAdapter ma = MultipoleAdapter(originDatom_->getAtomType());
    Vector3d zaxis;
    if (ma.isDipole()) {
      zaxis = originDatom_->getDipole();
    } else {
      zaxis = originDatom_->getA().transpose() * V3Z;
    }

    Vector3d xaxis = cross(v1, zaxis);
    Vector3d yaxis = cross(zaxis, xaxis);

    xaxis.normalize();
    yaxis.normalize();
    zaxis.normalize();

    rotMat_.setRow(0, xaxis);
    rotMat_.setRow(1, yaxis);
    rotMat_.setRow(2, zaxis);
  }